

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

string * __thiscall
pfederc::EnumExpr::toString_abi_cxx11_(string *__return_storage_ptr__,EnumExpr *this)

{
  Token *pTVar1;
  pointer puVar2;
  tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  *constructor;
  pointer ptVar3;
  char cVar4;
  bool bVar5;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *param;
  pointer puVar6;
  string local_58;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"enum","");
  if ((this->templs).
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->templs).
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _templateToString_abi_cxx11_(&local_58,&this->templs);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  cVar4 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar4);
  (*this->tokId->_vptr_Token[2])(&local_58,this->tokId,(this->super_Expr).lexer);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::push_back(cVar4);
  ptVar3 = (this->constructors).
           super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->constructors).
             super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar3 != local_38) {
    do {
      pTVar1 = (ptVar3->
               super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
               ).super__Head_base<0UL,_const_pfederc::Token_*,_false>._M_head_impl;
      (*pTVar1->_vptr_Token[2])(&local_58,pTVar1,(this->super_Expr).lexer);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((ptVar3->
          super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
          ).
          super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
          .
          super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
          ._M_head_impl.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (ptVar3->
          super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
          ).
          super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
          .
          super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
          ._M_head_impl.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::push_back(cVar4);
        puVar6 = (ptVar3->
                 super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                 ).
                 super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                 .
                 super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (ptVar3->
                 super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                 ).
                 super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                 .
                 super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar6 != puVar2) {
          bVar5 = true;
          do {
            if (bVar5) {
              bVar5 = false;
            }
            else {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            (*((puVar6->_M_t).
               super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
               super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])
                      (&local_58);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            puVar6 = puVar6 + 1;
          } while (puVar6 != puVar2);
        }
        std::__cxx11::string::push_back(cVar4);
      }
      std::__cxx11::string::push_back(cVar4);
      ptVar3 = ptVar3 + 1;
    } while (ptVar3 != local_38);
  }
  std::__cxx11::string::push_back(cVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string EnumExpr::toString() const noexcept {
  std::string result = "enum";
  if (!templs.empty())
    result += _templateToString(templs);

  result += ' ';
  result += tokId->toString(getLexer());
  result += '\n';

  for (auto &constructor : constructors) {
    result += std::get<0>(constructor)->toString(getLexer());
    auto &params = std::get<1>(constructor);
    if (!params.empty()){
      result += '(';
      bool first = true;
      for (auto &param : params) {
        if (!first)
          result += ", ";
        else
          first = false;

        result += param->toString();
      }

      result += ')';
    }

    result += '\n';
  }

  result += ';';

  return result;
}